

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O1

void __thiscall Music_Emu::handle_fade(Music_Emu *this,long out_count,sample_t_conflict1 *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  if (0 < out_count) {
    iVar1 = this->out_time;
    iVar2 = this->fade_start;
    iVar3 = this->fade_step;
    lVar6 = 0;
    iVar9 = 0;
    do {
      lVar8 = (long)iVar9;
      lVar10 = out_count - lVar8;
      if (0x1ff < lVar10) {
        lVar10 = 0x200;
      }
      iVar7 = (iVar1 + iVar9) - iVar2;
      iVar5 = iVar7 + 0x1ff;
      if (-1 < iVar7) {
        iVar5 = iVar7;
      }
      lVar4 = CONCAT44(iVar5 >> 0x1f,iVar5 >> 9);
      iVar5 = ((int)(lVar4 % (long)iVar3) << 0xe) / iVar3;
      iVar5 = ((iVar5 >> 1) - iVar5) + 0x4000 >> ((byte)(lVar4 / (long)iVar3) & 0x1f);
      if (iVar5 < 0x40) {
        this->emu_track_ended_ = true;
        this->track_ended_ = true;
      }
      lVar6 = out_count - lVar6;
      if (0x1ff < lVar6) {
        lVar6 = 0x200;
      }
      if ((int)lVar6 != 0) {
        lVar6 = 0;
        do {
          out[lVar8 + lVar6] = (sample_t_conflict1)((uint)(out[lVar8 + lVar6] * iVar5) >> 0xe);
          lVar6 = lVar6 + 1;
        } while ((int)lVar10 != (int)lVar6);
      }
      iVar9 = iVar9 + 0x200;
      lVar6 = (long)iVar9;
    } while (lVar6 < out_count);
  }
  return;
}

Assistant:

void Music_Emu::handle_fade( long out_count, sample_t* out )
{
	for ( int i = 0; i < out_count; i += fade_block_size )
	{
		int const shift = 14;
		int const unit = 1 << shift;
		int gain = int_log( (out_time + i - fade_start) / fade_block_size,
				fade_step, unit );
		if ( gain < (unit >> fade_shift) )
			track_ended_ = emu_track_ended_ = true;
		
		sample_t* io = &out [i];
		for ( int count = min( fade_block_size, out_count - i ); count; --count )
		{
			*io = sample_t ((*io * gain) >> shift);
			++io;
		}
	}
}